

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall
kj::Vector<kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::Entry>::setCapacity
          (Vector<kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::Entry> *this,size_t newSize)

{
  Entry *pEVar1;
  Entry *__dest;
  size_t __n;
  ArrayBuilder<kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::Entry> local_38;
  
  pEVar1 = (this->builder).ptr;
  if (newSize < (ulong)((long)(this->builder).pos - (long)pEVar1 >> 4)) {
    (this->builder).pos = pEVar1 + newSize;
  }
  __dest = kj::_::HeapArrayDisposer::
           allocateUninitialized<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Entry>(newSize);
  local_38.endPtr = __dest + newSize;
  local_38.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  pEVar1 = (this->builder).ptr;
  __n = (long)(this->builder).pos - (long)pEVar1;
  local_38.ptr = __dest;
  if (__n != 0) {
    memcpy(__dest,pEVar1,__n);
  }
  local_38.pos = (RemoveConst<kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::Entry> *)
                 ((long)__dest + __n);
  ArrayBuilder<kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::Entry>::operator=
            (&this->builder,&local_38);
  ArrayBuilder<kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::Entry>::dispose(&local_38);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }